

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int get_S2prot(CPUARMState_conflict *env,int s2ap,int xn)

{
  _Bool _Var1;
  uint local_1c;
  int prot;
  int xn_local;
  int s2ap_local;
  CPUARMState_conflict *env_local;
  
  local_1c = (uint)((s2ap & 1U) != 0);
  if ((s2ap & 2U) != 0) {
    local_1c = local_1c | 2;
  }
  if ((xn == 0) && ((_Var1 = arm_el_is_aa64(env,2), _Var1 || ((local_1c & 1) != 0)))) {
    local_1c = local_1c | 4;
  }
  return local_1c;
}

Assistant:

static int get_S2prot(CPUARMState *env, int s2ap, int xn)
{
    int prot = 0;

    if (s2ap & 1) {
        prot |= PAGE_READ;
    }
    if (s2ap & 2) {
        prot |= PAGE_WRITE;
    }
    if (!xn) {
        if (arm_el_is_aa64(env, 2) || prot & PAGE_READ) {
            prot |= PAGE_EXEC;
        }
    }
    return prot;
}